

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_write.c
# Opt level: O2

tmsize_t TIFFWriteRawStrip(TIFF *tif,uint32_t strip,void *data,tmsize_t cc)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *extraout_RDX;
  char *pcVar5;
  
  pcVar5 = (char *)data;
  if (((tif->tif_flags & 0x40) == 0) &&
     (iVar2 = TIFFWriteCheck(tif,0,"TIFFWriteRawStrip"), pcVar5 = extraout_RDX, iVar2 == 0)) {
    return -1;
  }
  if ((tif->tif_dir).td_nstrips <= strip) {
    if ((tif->tif_dir).td_planarconfig == 2) {
      pcVar5 = "Can not grow image by strips when using separate planes";
      goto LAB_0026f75b;
    }
    if ((tif->tif_dir).td_stripsperimage <= strip) {
      uVar4 = (tif->tif_dir).td_imagelength;
      pcVar5 = (char *)(ulong)uVar4;
      uVar1 = (tif->tif_dir).td_rowsperstrip;
      uVar3 = 0;
      if (uVar4 < -uVar1) {
        uVar4 = (uVar4 + uVar1) - 1;
        uVar3 = uVar4 / uVar1;
        pcVar5 = (char *)((ulong)uVar4 % (ulong)uVar1);
      }
      (tif->tif_dir).td_stripsperimage = uVar3;
    }
    iVar2 = TIFFGrowStrips(tif,0x2eb660,pcVar5);
    if (iVar2 == 0) {
      return -1;
    }
  }
  if (tif->tif_curstrip != strip) {
    tif->tif_curstrip = strip;
    tif->tif_curoff = 0;
  }
  uVar4 = (tif->tif_dir).td_stripsperimage;
  if (uVar4 != 0) {
    tif->tif_row = (strip % uVar4) * (tif->tif_dir).td_rowsperstrip;
    iVar2 = TIFFAppendToStrip(tif,strip,(uint8_t *)data,cc);
    return -(ulong)(iVar2 == 0) | cc;
  }
  pcVar5 = "Zero strips per image";
LAB_0026f75b:
  TIFFErrorExtR(tif,"TIFFWriteRawStrip",pcVar5);
  return -1;
}

Assistant:

tmsize_t TIFFWriteRawStrip(TIFF *tif, uint32_t strip, void *data, tmsize_t cc)
{
    static const char module[] = "TIFFWriteRawStrip";
    TIFFDirectory *td = &tif->tif_dir;

    if (!WRITECHECKSTRIPS(tif, module))
        return ((tmsize_t)-1);
    /*
     * Check strip array to make sure there's space.
     * We don't support dynamically growing files that
     * have data organized in separate bitplanes because
     * it's too painful.  In that case we require that
     * the imagelength be set properly before the first
     * write (so that the strips array will be fully
     * allocated above).
     */
    if (strip >= td->td_nstrips)
    {
        if (td->td_planarconfig == PLANARCONFIG_SEPARATE)
        {
            TIFFErrorExtR(
                tif, module,
                "Can not grow image by strips when using separate planes");
            return ((tmsize_t)-1);
        }
        /*
         * Watch out for a growing image.  The value of
         * strips/image will initially be 1 (since it
         * can't be deduced until the imagelength is known).
         */
        if (strip >= td->td_stripsperimage)
            td->td_stripsperimage =
                TIFFhowmany_32(td->td_imagelength, td->td_rowsperstrip);
        if (!TIFFGrowStrips(tif, 1, module))
            return ((tmsize_t)-1);
    }

    if (tif->tif_curstrip != strip)
    {
        tif->tif_curstrip = strip;

        /* this informs TIFFAppendToStrip() we have changed or reset strip */
        tif->tif_curoff = 0;
    }

    if (td->td_stripsperimage == 0)
    {
        TIFFErrorExtR(tif, module, "Zero strips per image");
        return ((tmsize_t)-1);
    }
    tif->tif_row = (strip % td->td_stripsperimage) * td->td_rowsperstrip;
    return (TIFFAppendToStrip(tif, strip, (uint8_t *)data, cc) ? cc
                                                               : (tmsize_t)-1);
}